

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void expr_field(LexState *ls,ExpDesc *v)

{
  undefined1 local_38 [8];
  ExpDesc key;
  FuncState *fs;
  ExpDesc *v_local;
  LexState *ls_local;
  
  key._16_8_ = ls->fs;
  expr_toanyreg((FuncState *)key._16_8_,v);
  lj_lex_next(ls);
  expr_str(ls,(ExpDesc *)local_38);
  expr_index((FuncState *)key._16_8_,v,(ExpDesc *)local_38);
  return;
}

Assistant:

static void expr_field(LexState *ls, ExpDesc *v)
{
  FuncState *fs = ls->fs;
  ExpDesc key;
  expr_toanyreg(fs, v);
  lj_lex_next(ls);  /* Skip dot or colon. */
  expr_str(ls, &key);
  expr_index(fs, v, &key);
}